

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp_rect_pack.h
# Opt level: O0

bool __thiscall
dp::rect_pack::RectPacker<int>::Page::tryGrow(Page *this,Context *ctx,Size *rect,Position *pos)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  bool canGrowRight;
  bool mustGrowDown;
  bool canGrowDown;
  int freeH;
  int freeW;
  Position *pos_local;
  Size *rect_local;
  Context *ctx_local;
  Page *this_local;
  
  if ((ctx->maxSize).w < (this->rootSize).w) {
    __assert_fail("ctx.maxSize.w >= rootSize.w",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/external/dp_rect_pack.h"
                  ,499,
                  "bool dp::rect_pack::RectPacker<>::Page::tryGrow(Context &, const Size &, Position &) [GeomT = int]"
                 );
  }
  iVar3 = (ctx->maxSize).w - (this->rootSize).w;
  if ((this->rootSize).h <= (ctx->maxSize).h) {
    iVar4 = (ctx->maxSize).h - (this->rootSize).h;
    bVar1 = false;
    if (rect->h <= iVar4) {
      bVar1 = (ctx->spacing).y <= iVar4 - rect->h;
    }
    bVar2 = false;
    if ((bVar1) && (bVar2 = false, (ctx->spacing).x <= iVar3)) {
      bVar2 = (this->rootSize).h + rect->h + (ctx->spacing).y <=
              (this->rootSize).w + (ctx->spacing).x;
    }
    if (bVar2) {
      growDown(this,ctx,rect,pos);
      this_local._7_1_ = true;
    }
    else {
      bVar2 = false;
      if (rect->w <= iVar3) {
        bVar2 = (ctx->spacing).x <= iVar3 - rect->w;
      }
      if (bVar2) {
        growRight(this,ctx,rect,pos);
        this_local._7_1_ = true;
      }
      else if (bVar1) {
        growDown(this,ctx,rect,pos);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    return this_local._7_1_;
  }
  __assert_fail("ctx.maxSize.h >= rootSize.h",
                "/workspace/llm4binary/github/license_all_cmakelists_25/danpla[P]dpfontbaker/src/external/dp_rect_pack.h"
                ,0x1f5,
                "bool dp::rect_pack::RectPacker<>::Page::tryGrow(Context &, const Size &, Position &) [GeomT = int]"
               );
}

Assistant:

bool RectPacker<GeomT>::Page::tryGrow(
    Context& ctx, const Size& rect, Position& pos)
{
    assert(ctx.maxSize.w >= rootSize.w);
    const GeomT freeW = ctx.maxSize.w - rootSize.w;
    assert(ctx.maxSize.h >= rootSize.h);
    const GeomT freeH = ctx.maxSize.h - rootSize.h;

    const bool canGrowDown = (
        freeH >= rect.h && freeH - rect.h >= ctx.spacing.y);
    const bool mustGrowDown = (
        canGrowDown
        && freeW >= ctx.spacing.x
        && (rootSize.w + ctx.spacing.x
            >= rootSize.h + rect.h + ctx.spacing.y));
    if (mustGrowDown) {
        growDown(ctx, rect, pos);
        return true;
    }

    const bool canGrowRight = (
        freeW >= rect.w && freeW - rect.w >= ctx.spacing.x);
    if (canGrowRight) {
        growRight(ctx, rect, pos);
        return true;
    }

    if (canGrowDown) {
        growDown(ctx, rect, pos);
        return true;
    }

    return false;
}